

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandAbc9If(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  If_LibLut_t *pIVar6;
  size_t sVar7;
  If_DsdMan_t *pIVar8;
  long lVar9;
  Gia_Man_t *pGVar10;
  ulong uVar11;
  long lVar12;
  char *pcVar13;
  char *pcVar14;
  long lVar15;
  long lVar16;
  double dVar17;
  If_Par_t Pars;
  char Buffer [200];
  char LutSize [200];
  uint local_318;
  uint local_314;
  uint local_310;
  uint local_30c;
  uint local_308;
  float local_300;
  float local_2fc;
  uint local_2f8;
  uint local_2f4;
  uint local_2f0;
  uint local_2ec;
  uint local_2e8;
  uint local_2e4;
  uint local_2dc;
  uint local_2d4;
  uint local_2d0;
  uint local_2cc;
  uint local_2c8;
  uint local_2c4;
  uint local_2c0;
  uint local_2bc;
  uint local_2b8;
  uint local_2ac;
  uint local_2a8;
  uint local_2a4;
  int local_2a0;
  uint local_294;
  uint local_290;
  uint local_28c;
  uint local_288;
  uint local_284;
  uint local_280;
  uint local_27c;
  uint local_278;
  uint local_274;
  uint local_270;
  uint local_26c;
  uint local_268;
  char *local_260;
  float local_258;
  undefined8 local_24c;
  void *local_210;
  code *local_1e8;
  undefined6 local_1c8;
  undefined2 uStack_1c2;
  undefined6 uStack_1c0;
  undefined8 local_f8 [25];
  
  Gia_ManSetIfParsDefault(&local_318);
  if (pAbc->pLibLut == (void *)0x0) {
    Abc_Print(-1,"LUT library is not given. Using default LUT library.\n");
    pIVar6 = If_LibLutSetSimple(6);
    pAbc->pLibLut = pIVar6;
  }
  local_210 = pAbc->pLibLut;
  Extra_UtilGetoptReset();
LAB_00281a29:
  iVar2 = Extra_UtilGetopt(argc,argv,"KCFAGRDEWSTXYqalepmrsdbgxyofuijkztncvwh");
  iVar3 = globalUtilOptind;
  switch(iVar2) {
  case 0x41:
    if (argc <= globalUtilOptind) {
      pcVar14 = "Command line switch \"-A\" should be followed by a positive integer.\n";
      goto LAB_00281ee7;
    }
    local_30c = atoi(argv[globalUtilOptind]);
    uVar4 = local_30c;
    break;
  case 0x42:
  case 0x48:
  case 0x49:
  case 0x4a:
  case 0x4c:
  case 0x4d:
  case 0x4e:
  case 0x4f:
  case 0x50:
  case 0x51:
  case 0x55:
  case 0x56:
  case 0x5a:
  case 0x5b:
  case 0x5c:
  case 0x5d:
  case 0x5e:
  case 0x5f:
  case 0x60:
    goto switchD_00281a49_caseD_42;
  case 0x43:
    if (argc <= globalUtilOptind) {
      pcVar14 = "Command line switch \"-C\" should be followed by a positive integer.\n";
      goto LAB_00281ee7;
    }
    local_314 = atoi(argv[globalUtilOptind]);
    uVar4 = local_314;
    break;
  case 0x44:
    if (argc <= globalUtilOptind) {
      pcVar14 = "Command line switch \"-D\" should be followed by a floating point number.\n";
      goto LAB_00281ee7;
    }
    dVar17 = atof(argv[globalUtilOptind]);
    local_300 = (float)dVar17;
    globalUtilOptind = iVar3 + 1;
    if (local_300 <= 0.0) goto switchD_00281a49_caseD_42;
    goto LAB_00281a29;
  case 0x45:
    if (argc <= globalUtilOptind) {
      pcVar14 = "Command line switch \"-E\" should be followed by a floating point number.\n";
      goto LAB_00281ee7;
    }
    dVar17 = atof(argv[globalUtilOptind]);
    local_2fc = (float)dVar17;
    globalUtilOptind = iVar3 + 1;
    if ((local_2fc < 0.0) || (1.0 < local_2fc)) goto switchD_00281a49_caseD_42;
    goto LAB_00281a29;
  case 0x46:
    if (argc <= globalUtilOptind) {
      pcVar14 = "Command line switch \"-F\" should be followed by a positive integer.\n";
      goto LAB_00281ee7;
    }
    local_310 = atoi(argv[globalUtilOptind]);
    uVar4 = local_310;
    break;
  case 0x47:
    if (argc <= globalUtilOptind) {
      pcVar14 = 
      "Command line switch \"-G\" should be followed by a positive integer no less than 3.\n";
      goto LAB_00281ee7;
    }
    local_308 = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar3 + 1;
    if ((int)local_308 < 2) goto switchD_00281a49_caseD_42;
    goto LAB_00281a29;
  case 0x4b:
    if (argc <= globalUtilOptind) {
      pcVar14 = "Command line switch \"-K\" should be followed by a positive integer.\n";
      goto LAB_00281ee7;
    }
    local_318 = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar3 + 1;
    if ((int)local_318 < 0) goto switchD_00281a49_caseD_42;
    local_210 = (void *)0x0;
    goto LAB_00281a29;
  case 0x52:
    if (argc <= globalUtilOptind) {
      pcVar14 = "Command line switch \"-R\" should be followed by a floating point number.\n";
      iVar3 = 1;
LAB_00281ec2:
      Abc_Print(iVar3,pcVar14);
      return 0;
    }
    local_2f8 = atoi(argv[globalUtilOptind]);
    uVar4 = local_2f8;
    break;
  case 0x53:
    if (globalUtilOptind < argc) {
      local_260 = argv[globalUtilOptind];
      globalUtilOptind = globalUtilOptind + 1;
      sVar7 = strlen(local_260);
      if ((sVar7 & 0xfffffffffffffffe) != 2) {
        pcVar14 = 
        "Command line switch \"-S\" should be followed by a 2- or 3-char string (e.g. \"44\" or \"555\").\n"
        ;
        goto LAB_00281ee7;
      }
      goto LAB_00281a29;
    }
    pcVar14 = "Command line switch \"-S\" should be followed by string.\n";
    goto LAB_00281ee7;
  case 0x54:
    if (globalUtilOptind < argc) {
      local_2f4 = atoi(argv[globalUtilOptind]);
      globalUtilOptind = iVar3 + 1;
      if (2 < local_2f4) goto switchD_00281a49_caseD_42;
      goto LAB_00281a29;
    }
    pcVar14 = "Command line switch \"-T\" should be followed by a positive integer 0,1,or 2.\n";
LAB_00281ee7:
    Abc_Print(-1,pcVar14);
    goto switchD_00281a49_caseD_42;
  case 0x57:
    if (argc <= globalUtilOptind) {
      pcVar14 = "Command line switch \"-W\" should be followed by a floating point number.\n";
      goto LAB_00281ee7;
    }
    dVar17 = atof(argv[globalUtilOptind]);
    local_258 = (float)dVar17;
    globalUtilOptind = iVar3 + 1;
    if (local_258 < 0.0) {
switchD_00281a49_caseD_42:
      if ((local_300 != -1.0) || (NAN(local_300))) {
        sprintf((char *)&local_1c8,"%.2f",(double)local_300);
      }
      else {
        uStack_1c0 = 0x656c626973;
        local_1c8 = 0x702074736562;
        uStack_1c2 = 0x736f;
      }
      if (local_318 == 0xffffffff) {
        local_f8[0] = 0x7972617262696c;
      }
      else {
        sprintf((char *)local_f8,"%d");
      }
      Abc_Print(-2,
                "usage: &if [-KCFAGRTXY num] [-DEW float] [-S str] [-qarlepmsdbgxyofuijkztnchvw]\n")
      ;
      Abc_Print(-2,"\t           performs FPGA technology mapping of the network\n");
      Abc_Print(-2,"\t-K num   : the number of LUT inputs (2 < num < %d) [default = %s]\n",0x21,
                local_f8);
      Abc_Print(-2,"\t-C num   : the max number of priority cuts (0 < num < 2^12) [default = %d]\n",
                (ulong)local_314);
      Abc_Print(-2,
                "\t-F num   : the number of area flow recovery iterations (num >= 0) [default = %d]\n"
                ,(ulong)local_310);
      Abc_Print(-2,
                "\t-A num   : the number of exact area recovery iterations (num >= 0) [default = %d]\n"
                ,(ulong)local_30c);
      Abc_Print(-2,"\t-G num   : the max AND/OR gate size for mapping (0 = unused) [default = %d]\n"
                ,(ulong)local_308);
      Abc_Print(-2,"\t-R num   : the delay relaxation ratio (num >= 0) [default = %d]\n",
                (ulong)local_2f8);
      Abc_Print(-2,"\t-T num   : the type of LUT structures [default = any]\n",(ulong)local_2f4);
      Abc_Print(-2,"\t-X num   : delay of AND-gate in LUT library units [default = %d]\n",
                (ulong)local_2f0);
      Abc_Print(-2,"\t-Y num   : area of AND-gate in LUT library units [default = %d]\n",
                (ulong)local_2ec);
      Abc_Print(-2,"\t-D float : sets the delay constraint for the mapping [default = %s]\n",
                &local_1c8);
      Abc_Print(-2,"\t-E float : sets epsilon used for tie-breaking [default = %f]\n",
                (double)local_2fc);
      Abc_Print(-2,"\t-W float : sets wire delay between adjects LUTs [default = %f]\n",
                (double)local_258);
      pcVar14 = "not used";
      if (local_260 != (char *)0x0) {
        pcVar14 = local_260;
      }
      Abc_Print(-2,"\t-S str   : string representing the LUT structure [default = %s]\n",pcVar14);
      pcVar13 = "yes";
      pcVar14 = "yes";
      if (local_2e8 == 0) {
        pcVar14 = "no";
      }
      Abc_Print(-2,
                "\t-q       : toggles preprocessing using several starting points [default = %s]\n",
                pcVar14);
      pcVar14 = "yes";
      if (local_2e4 == 0) {
        pcVar14 = "no";
      }
      Abc_Print(-2,"\t-a       : toggles area-oriented mapping [default = %s]\n",pcVar14);
      pcVar14 = "yes";
      if (local_2dc == 0) {
        pcVar14 = "no";
      }
      Abc_Print(-2,"\t-r       : enables expansion/reduction of the best cuts [default = %s]\n",
                pcVar14);
      pcVar14 = "yes";
      if (local_2d4 == 0) {
        pcVar14 = "no";
      }
      Abc_Print(-2,
                "\t-l       : toggle restricting the type of 6-input lookup tables [default = %s]\n"
                ,pcVar14);
      pcVar14 = "yes";
      if (local_2d0 == 0) {
        pcVar14 = "no";
      }
      Abc_Print(-2,"\t-e       : uses edge-based cut selection heuristics [default = %s]\n",pcVar14)
      ;
      pcVar14 = "yes";
      if (local_2cc == 0) {
        pcVar14 = "no";
      }
      Abc_Print(-2,"\t-p       : uses power-aware cut selection heuristics [default = %s]\n",pcVar14
               );
      pcVar14 = "yes";
      if (local_2c8 == 0) {
        pcVar14 = "no";
      }
      Abc_Print(-2,
                "\t-m       : enables cut minimization by removing vacuous variables [default = %s]\n"
                ,pcVar14);
      pcVar14 = "yes";
      if (local_2c0 == 0) {
        pcVar14 = "no";
      }
      Abc_Print(-2,"\t-s       : toggles delay-oriented mapping used with -S <NN> [default = %s]\n",
                pcVar14);
      pcVar14 = "yes";
      if (local_2ac == 0) {
        pcVar14 = "no";
      }
      Abc_Print(-2,"\t-d       : toggles deriving specialized matching step [default = %s]\n",
                pcVar14);
      pcVar14 = "yes";
      if (local_2a8 == 0) {
        pcVar14 = "no";
      }
      Abc_Print(-2,"\t-b       : toggles the use of one special feature [default = %s]\n",pcVar14);
      pcVar14 = "yes";
      if (local_2c4 == 0) {
        pcVar14 = "no";
      }
      Abc_Print(-2,"\t-g       : toggles delay optimization by SOP balancing [default = %s]\n",
                pcVar14);
      pcVar14 = "yes";
      if (local_2bc == 0) {
        pcVar14 = "no";
      }
      Abc_Print(-2,"\t-x       : toggles delay optimization by DSD balancing [default = %s]\n",
                pcVar14);
      pcVar14 = "yes";
      if (local_2b8 == 0) {
        pcVar14 = "no";
      }
      Abc_Print(-2,"\t-y       : toggles delay optimization with recorded library [default = %s]\n",
                pcVar14);
      pcVar14 = "yes";
      if (local_2a4 == 0) {
        pcVar14 = "no";
      }
      Abc_Print(-2,
                "\t-o       : toggles using buffers to decouple combinational outputs [default = %s]\n"
                ,pcVar14);
      pcVar14 = "yes";
      if (local_294 == 0) {
        pcVar14 = "no";
      }
      Abc_Print(-2,"\t-f       : toggles enabling additional check [default = %s]\n",pcVar14);
      pcVar14 = "yes";
      if (local_290 == 0) {
        pcVar14 = "no";
      }
      Abc_Print(-2,"\t-u       : toggles enabling additional check [default = %s]\n",pcVar14);
      pcVar14 = "yes";
      if (local_284 == 0) {
        pcVar14 = "no";
      }
      Abc_Print(-2,"\t-i       : toggles using cofactoring variables [default = %s]\n",pcVar14);
      pcVar14 = "yes";
      if (local_280 == 0) {
        pcVar14 = "no";
      }
      Abc_Print(-2,"\t-j       : toggles using AND bi-decomposition [default = %s]\n",pcVar14);
      pcVar14 = "yes";
      if (local_288 == 0) {
        pcVar14 = "no";
      }
      Abc_Print(-2,"\t-k       : toggles matching based on precomputed DSD manager [default = %s]\n"
                ,pcVar14);
      pcVar14 = "yes";
      if (local_278 == 0) {
        pcVar14 = "no";
      }
      Abc_Print(-2,
                "\t-z       : toggles deriving LUTs when mapping into LUT structures [default = %s]\n"
                ,pcVar14);
      pcVar14 = "yes";
      if (local_274 == 0) {
        pcVar14 = "no";
      }
      Abc_Print(-2,
                "\t-t       : toggles optimizing average rather than maximum level [default = %s]\n"
                ,pcVar14);
      pcVar14 = "yes";
      if (local_28c == 0) {
        pcVar14 = "no";
      }
      Abc_Print(-2,"\t-n       : toggles computing DSDs of the cut functions [default = %s]\n",
                pcVar14);
      pcVar14 = "yes";
      if (local_27c == 0) {
        pcVar14 = "no";
      }
      Abc_Print(-2,"\t-c       : toggles computing truth tables in a new way [default = %s]\n",
                pcVar14);
      pcVar14 = "yes";
      if (local_270 == 0) {
        pcVar14 = "no";
      }
      Abc_Print(-2,"\t-h       : toggles rehashing AIG after mapping [default = %s]\n",pcVar14);
      pcVar14 = "yes";
      if (local_26c == 0) {
        pcVar14 = "no";
      }
      Abc_Print(-2,"\t-v       : toggles verbose output [default = %s]\n",pcVar14);
      if (local_268 == 0) {
        pcVar13 = "no";
      }
      Abc_Print(-2,"\t-w       : toggles printing delay trace [default = %s]\n",pcVar13);
      return 1;
    }
    goto LAB_00281a29;
  case 0x58:
    if (argc <= globalUtilOptind) {
      pcVar14 = "Command line switch \"-X\" should be followed by a positive integer 0,1,or 2.\n";
      goto LAB_00281ee7;
    }
    local_2f0 = atoi(argv[globalUtilOptind]);
    uVar4 = local_2ec;
    break;
  case 0x59:
    if (argc <= globalUtilOptind) {
      pcVar14 = "Command line switch \"-Y\" should be followed by a positive integer 0,1,or 2.\n";
      goto LAB_00281ee7;
    }
    local_2ec = atoi(argv[globalUtilOptind]);
    uVar4 = local_2f0;
    break;
  case 0x61:
    local_2e4 = local_2e4 ^ 1;
    goto LAB_00281a29;
  case 0x62:
    local_2a8 = local_2a8 ^ 1;
    goto LAB_00281a29;
  case 99:
    local_27c = local_27c ^ 1;
    goto LAB_00281a29;
  case 100:
    local_2ac = local_2ac ^ 1;
    goto LAB_00281a29;
  case 0x65:
    local_2d0 = local_2d0 ^ 1;
    goto LAB_00281a29;
  case 0x66:
    local_294 = local_294 ^ 1;
    goto LAB_00281a29;
  case 0x67:
    local_2c4 = local_2c4 ^ 1;
    goto LAB_00281a29;
  case 0x68:
    local_270 = local_270 ^ 1;
    goto LAB_00281a29;
  case 0x69:
    local_284 = local_284 ^ 1;
    goto LAB_00281a29;
  case 0x6a:
    local_280 = local_280 ^ 1;
    goto LAB_00281a29;
  case 0x6b:
    local_288 = local_288 ^ 1;
    goto LAB_00281a29;
  case 0x6c:
    local_2d4 = local_2d4 ^ 1;
    goto LAB_00281a29;
  case 0x6d:
    local_2c8 = local_2c8 ^ 1;
    goto LAB_00281a29;
  case 0x6e:
    local_28c = local_28c ^ 1;
    goto LAB_00281a29;
  case 0x6f:
    local_2a4 = local_2a4 ^ 1;
    goto LAB_00281a29;
  case 0x70:
    local_2cc = local_2cc ^ 1;
    goto LAB_00281a29;
  case 0x71:
    local_2e8 = local_2e8 ^ 1;
    goto LAB_00281a29;
  case 0x72:
    local_2dc = local_2dc ^ 1;
    goto LAB_00281a29;
  case 0x73:
    local_2c0 = local_2c0 ^ 1;
    goto LAB_00281a29;
  case 0x74:
    local_274 = local_274 ^ 1;
    goto LAB_00281a29;
  case 0x75:
    local_290 = local_290 ^ 1;
    goto LAB_00281a29;
  case 0x76:
    local_26c = local_26c ^ 1;
    goto LAB_00281a29;
  case 0x77:
    local_268 = local_268 ^ 1;
    goto LAB_00281a29;
  case 0x78:
    local_2bc = local_2bc ^ 1;
    goto LAB_00281a29;
  case 0x79:
    local_2b8 = local_2b8 ^ 1;
    goto LAB_00281a29;
  case 0x7a:
    local_278 = local_278 ^ 1;
    goto LAB_00281a29;
  default:
    if (iVar2 == -1) {
      pGVar10 = pAbc->pGia;
      if (pGVar10 == (Gia_Man_t *)0x0) {
        pcVar14 = Abc_FrameReadFlag("silentmode");
        if (pcVar14 != (char *)0x0) {
          return 0;
        }
        pcVar14 = "Empty GIA network.\n";
        iVar3 = -1;
        goto LAB_00281ec2;
      }
      if (pGVar10->nBufs != 0) {
        pcVar14 = "This command does not work with barrier buffers.\n";
        goto LAB_0028249f;
      }
      if (pGVar10->vMapping != (Vec_Int_t *)0x0) {
        pcVar14 = "Current AIG has mapping. Run \"&st\".\n";
        goto LAB_0028249f;
      }
      if (local_318 == 0xffffffff) {
        if (local_210 == (void *)0x0) {
          pcVar14 = "The LUT library is not given.\n";
          goto LAB_0028249f;
        }
        local_318 = *(uint *)((long)local_210 + 8);
      }
      uVar11 = (ulong)local_318;
      if (local_318 - 0x21 < 0xffffffe1) {
        pcVar14 = "Incorrect LUT size (%d).\n";
        goto LAB_002824e0;
      }
      if (local_314 - 0x1000 < 0xfffff001) {
        pcVar14 = "Incorrect number of cuts.\n";
        goto LAB_0028249f;
      }
      if (pGVar10->pSibls != (int *)0x0) {
        local_2dc = 0;
      }
      if (local_2a8 != 0) {
        if (local_318 - 7 < 0xfffffffd) {
          pcVar14 = "This feature only works for {4,5,6}-LUTs.\n";
          goto LAB_0028249f;
        }
        local_2c8 = 1;
      }
      if (1 < (int)((local_284 + local_2a0 + local_288 + local_294 + local_290 + 1) -
                   (uint)(local_260 == (char *)0x0))) {
        pcVar14 = "Only one additional check can be performed at the same time.\n";
        goto LAB_0028249f;
      }
      if (local_2a0 != 0) {
        if (local_318 - 8 < 0xfffffffe) {
          pcVar14 = "This feature only works for {6,7}-LUTs.\n";
          goto LAB_0028249f;
        }
        local_1e8 = If_CutPerformCheck07;
        local_2c8 = 1;
      }
      if (local_284 != 0) {
        if ((local_318 & 1) == 0) {
          pcVar14 = "This feature only works for odd-sized LUTs.\n";
          goto LAB_0028249f;
        }
        local_2c8 = 1;
      }
      if (local_280 != 0) {
        local_2c8 = 1;
      }
      if (local_288 != 0) {
        pIVar8 = (If_DsdMan_t *)Abc_FrameReadManDsd();
        uVar4 = local_318;
        if (pIVar8 == (If_DsdMan_t *)0x0) {
          pcVar14 = "DSD manager is not available.\n";
          goto LAB_0028249f;
        }
        iVar3 = If_DsdManVarNum(pIVar8);
        uVar5 = local_318;
        if (iVar3 < (int)uVar4) {
          uVar4 = If_DsdManVarNum(pIVar8);
          Abc_Print(-1,
                    "LUT size (%d) is more than the number of variables in the DSD manager (%d).\n",
                    (ulong)uVar5,(ulong)uVar4);
          return 1;
        }
        if ((local_278 != 0) && (pcVar14 = If_DsdManGetCellStr(pIVar8), pcVar14 == (char *)0x0)) {
          pcVar14 = "DSD manager is not matched with any particular cell.\n";
          goto LAB_0028249f;
        }
        local_2c8 = 1;
        local_28c = 1;
        If_DsdManSetNewAsUseless(pIVar8);
      }
      if (local_294 != 0 || local_290 != 0) {
        if (local_294 != 0 && local_290 != 0) {
          pcVar14 = "Switches -f and -u are not compatible.\n";
          goto LAB_0028249f;
        }
        if (local_318 - 9 < 0xfffffffc) {
          pcVar14 = "This feature only works for {6,7,8}-LUTs.\n";
          goto LAB_0028249f;
        }
        local_1e8 = If_CutPerformCheck75;
        local_2c8 = 1;
      }
      if (local_260 != (char *)0x0) {
        if (local_2bc != 0) {
          pcVar14 = "Incompatible options (-S and -x).\n";
          goto LAB_0028249f;
        }
        if (local_318 - 0x11 < 0xfffffff5) {
          pcVar14 = "This feature only works for [6;16]-LUTs.\n";
          goto LAB_0028249f;
        }
        if (local_2c0 == 0) {
          local_1e8 = If_CutPerformCheck16;
        }
        else {
          local_1e8 = (code *)0x0;
        }
        local_2c8 = 1;
      }
      if (local_2ac != 0) {
        local_24c = CONCAT44(local_24c._4_4_,1);
        local_2c8 = 1;
        local_318 = 4;
      }
      if (local_278 != 0 || local_2c8 != 0) {
        local_24c = CONCAT44(local_24c._4_4_,1);
        local_2dc = 0;
        if ((local_260 == (char *)0x0) && (local_288 == 0)) {
          local_278 = 1;
        }
      }
      if (local_2b8 != 0) {
        local_24c = 0x100000001;
        local_2c8 = 1;
        local_2dc = 0;
        local_210 = (void *)0x0;
      }
      if ((local_2c4 != 0 || local_2bc != 0) || local_2c0 != 0) {
        local_24c = CONCAT44(local_24c._4_4_,1);
        local_2c8 = 1;
        local_2dc = 0;
        local_28c = (uint)(local_2bc != 0 || local_2c0 != 0);
        local_210 = (void *)0x0;
      }
      if (0 < (int)local_308) {
        local_24c = 0x100000001;
        local_2c8 = 1;
        local_2dc = 0;
        local_210 = (void *)0x0;
        local_318 = local_308;
      }
      if (((local_28c != 0) || (local_27c != 0)) || (local_2d4 != 0)) {
        local_24c = CONCAT44(local_24c._4_4_,1);
        local_2c8 = 1;
        local_2dc = 0;
      }
      if (local_28c != 0) {
        uVar4 = 0;
        if ((local_260 != (char *)0x0) && (uVar4 = 0, local_260[2] == '\0')) {
          uVar4 = (int)*local_260 - 0x30;
        }
        pIVar8 = (If_DsdMan_t *)Abc_FrameReadManDsd();
        uVar5 = local_318;
        if ((local_260 == (char *)0x0) || (local_260[2] == '\0')) {
          if (pIVar8 != (If_DsdMan_t *)0x0) {
            iVar3 = If_DsdManVarNum(pIVar8);
            if (iVar3 < (int)uVar5) {
              pcVar14 = "DSD manager has incompatible number of variables.";
            }
            else {
              uVar5 = If_DsdManLutSize(pIVar8);
              if ((uVar4 == uVar5) || (local_2bc != 0)) {
                if (pIVar8 == (If_DsdMan_t *)0x0) goto LAB_00282908;
                goto LAB_00282b12;
              }
              pcVar14 = "DSD manager has different LUT size.";
            }
            goto LAB_002828f5;
          }
LAB_00282908:
          if ((0xc < (int)uVar4) || (0xc < (int)local_318)) {
            printf("Size of required DSD manager (%d) exceeds the precompiled limit (%d) (change parameter DAU_MAX_VAR).\n"
                   ,(ulong)uVar4,0xc);
            goto LAB_00282932;
          }
          pIVar8 = If_DsdManAlloc(local_318,uVar4);
          Abc_FrameSetManDsd(pIVar8);
LAB_00282b12:
          iVar3 = 1;
          bVar1 = true;
        }
        else {
          pcVar14 = "DSD only works for LUT structures XY.";
LAB_002828f5:
          puts(pcVar14);
LAB_00282932:
          bVar1 = false;
          iVar3 = 0;
        }
        if (!bVar1) {
          return iVar3;
        }
      }
      if (local_2b8 != 0) {
        iVar3 = Abc_NtkRecIsRunning3();
        if (iVar3 == 0) {
          puts("LMS manager is not running (use \"rec_start3\").");
          return 0;
        }
        uVar4 = Abc_NtkRecInputNum3();
        if (uVar4 != local_318) {
          uVar4 = Abc_NtkRecInputNum3();
          printf("The number of library inputs (%d) different from the K parameters (%d).\n",
                 (ulong)uVar4,(ulong)local_318);
          return 0;
        }
      }
      if (((int)local_24c != 0) && (0xf < (int)local_318)) {
        pcVar14 = "Truth tables cannot be computed for LUT larger than %d inputs.\n";
        uVar11 = 0xf;
LAB_002824e0:
        Abc_Print(-1,pcVar14,uVar11);
        return 1;
      }
      pGVar10 = pAbc->pGia;
      if ((pGVar10->pManTime == (void *)0x0) || (pAbc->pLibBox != (void *)0x0)) {
        if ((local_210 != (void *)0x0 && 0.0 < local_258) &&
           (uVar4 = *(uint *)((long)local_210 + 8), -1 < (int)uVar4)) {
          lVar9 = (long)local_210 + 0x94;
          lVar12 = 1;
          lVar15 = 0;
          do {
            lVar16 = 0;
            do {
              *(float *)(lVar9 + lVar16 * 4) = local_258 + *(float *)(lVar9 + lVar16 * 4);
              lVar16 = lVar16 + 1;
            } while (lVar12 != lVar16);
            lVar15 = lVar15 + 1;
            lVar12 = lVar12 + 1;
            lVar9 = lVar9 + 0x84;
          } while (lVar15 != (ulong)uVar4 + 1);
        }
        pGVar10 = Gia_ManPerformMapping(pGVar10,&local_318);
        if ((local_210 != (void *)0x0 && 0.0 < local_258) &&
           (uVar4 = *(uint *)((long)local_210 + 8), -1 < (int)uVar4)) {
          lVar9 = (long)local_210 + 0x94;
          lVar12 = 1;
          lVar15 = 0;
          do {
            lVar16 = 0;
            do {
              *(float *)(lVar9 + lVar16 * 4) = *(float *)(lVar9 + lVar16 * 4) - local_258;
              lVar16 = lVar16 + 1;
            } while (lVar12 != lVar16);
            lVar15 = lVar15 + 1;
            lVar12 = lVar12 + 1;
            lVar9 = lVar9 + 0x84;
          } while (lVar15 != (ulong)uVar4 + 1);
        }
        if (pGVar10 != (Gia_Man_t *)0x0) {
          Abc_FrameUpdateGia(pAbc,pGVar10);
          return 0;
        }
        pcVar14 = "Abc_CommandAbc9If(): Mapping of GIA has failed.\n";
      }
      else {
        pcVar14 = "Design has boxes but box library is not entered.\n";
      }
LAB_0028249f:
      Abc_Print(-1,pcVar14);
      return 1;
    }
    goto switchD_00281a49_caseD_42;
  }
  globalUtilOptind = iVar3 + 1;
  if ((int)uVar4 < 0) goto switchD_00281a49_caseD_42;
  goto LAB_00281a29;
}

Assistant:

int Abc_CommandAbc9If( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    char Buffer[200];
    char LutSize[200];
    Gia_Man_t * pNew;
    If_Par_t Pars, * pPars = &Pars;
    int c;
    // set defaults
    Gia_ManSetIfParsDefault( pPars );
    if ( pAbc->pLibLut == NULL )
    {
        Abc_Print( -1, "LUT library is not given. Using default LUT library.\n" );
        pAbc->pLibLut = If_LibLutSetSimple( 6 );
    }
    pPars->pLutLib = (If_LibLut_t *)pAbc->pLibLut;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "KCFAGRDEWSTXYqalepmrsdbgxyofuijkztncvwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'K':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-K\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->nLutSize = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nLutSize < 0 )
                goto usage;
            // if the LUT size is specified, disable library
            pPars->pLutLib = NULL;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->nCutsMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nCutsMax < 0 )
                goto usage;
            break;
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->nFlowIters = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nFlowIters < 0 )
                goto usage;
            break;
        case 'A':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-A\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->nAreaIters = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nAreaIters < 0 )
                goto usage;
            break;
        case 'G':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-G\" should be followed by a positive integer no less than 3.\n" );
                goto usage;
            }
            pPars->nGateSize = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nGateSize < 2 )
                goto usage;
            break;
        case 'R':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( 1, "Command line switch \"-R\" should be followed by a floating point number.\n" );
                return 0;
            }
            pPars->nRelaxRatio = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nRelaxRatio < 0 )
                goto usage;
            break;
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by a positive integer 0,1,or 2.\n" );
                goto usage;
            }
            pPars->nStructType = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nStructType < 0 || pPars->nStructType > 2 )
                goto usage;
            break;
        case 'X':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-X\" should be followed by a positive integer 0,1,or 2.\n" );
                goto usage;
            }
            pPars->nAndDelay = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nAndArea < 0 )
                goto usage;
            break;
        case 'Y':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-Y\" should be followed by a positive integer 0,1,or 2.\n" );
                goto usage;
            }
            pPars->nAndArea = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nAndDelay < 0 )
                goto usage;
            break;
        case 'D':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-D\" should be followed by a floating point number.\n" );
                goto usage;
            }
            pPars->DelayTarget = (float)atof(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->DelayTarget <= 0.0 )
                goto usage;
            break;
        case 'E':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-E\" should be followed by a floating point number.\n" );
                goto usage;
            }
            pPars->Epsilon = (float)atof(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->Epsilon < 0.0 || pPars->Epsilon > 1.0 )
                goto usage;
            break;
        case 'W':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-W\" should be followed by a floating point number.\n" );
                goto usage;
            }
            pPars->WireDelay = (float)atof(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->WireDelay < 0.0 )
                goto usage;
            break;
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by string.\n" );
                goto usage;
            }
            pPars->pLutStruct = argv[globalUtilOptind];
            globalUtilOptind++;
            if ( strlen(pPars->pLutStruct) != 2 && strlen(pPars->pLutStruct) != 3 )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by a 2- or 3-char string (e.g. \"44\" or \"555\").\n" );
                goto usage;
            }
            break;
        case 'q':
            pPars->fPreprocess ^= 1;
            break;
        case 'a':
            pPars->fArea ^= 1;
            break;
        case 'r':
            pPars->fExpRed ^= 1;
            break;
        case 'l':
            pPars->fLut6Filter ^= 1;
            break;
        case 'e':
            pPars->fEdge ^= 1;
            break;
        case 'p':
            pPars->fPower ^= 1;
            break;
        case 'm':
            pPars->fCutMin ^= 1;
            break;
        case 's':
            pPars->fDelayOptLut ^= 1;
            break;
        case 'd':
            pPars->fUse34Spec ^= 1;
            break;
        case 'b':
            pPars->fUseBat ^= 1;
            break;
        case 'g':
            pPars->fDelayOpt ^= 1;
            break;
        case 'x':
            pPars->fDsdBalance ^= 1;
            break;
        case 'y':
            pPars->fUserRecLib ^= 1;
            break;
        case 'o':
            pPars->fUseBuffs ^= 1;
            break;
        case 'f':
            pPars->fEnableCheck75 ^= 1;
            break;
        case 'u':
            pPars->fEnableCheck75u ^= 1;
            break;
        case 'i':
            pPars->fUseCofVars ^= 1;
            break;
//        case 'j':
//            pPars->fEnableCheck07 ^= 1;
//            break;
        case 'j':
            pPars->fUseAndVars ^= 1;
            break;
        case 'k':
            pPars->fUseDsdTune ^= 1;
            break;
        case 'z':
            pPars->fDeriveLuts ^= 1;
            break;
        case 't':
            pPars->fDoAverage ^= 1;
            break;
        case 'n':
            pPars->fUseDsd ^= 1;
            break;
        case 'c':
            pPars->fUseTtPerm ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'w':
            pPars->fVerboseTrace ^= 1;
            break;
        case 'h':
            pPars->fHashMapping ^= 1;
            break;
        default:
            goto usage;
        }
    }

    if ( pAbc->pGia == NULL )
    {
        if ( !Abc_FrameReadFlag("silentmode") )
        Abc_Print( -1, "Empty GIA network.\n" );
        return 0;
    }
    if ( Gia_ManBufNum(pAbc->pGia) )
    {
        Abc_Print( -1, "This command does not work with barrier buffers.\n" );
        return 1;
    }
    if ( Gia_ManHasMapping(pAbc->pGia) )
    {
        Abc_Print( -1, "Current AIG has mapping. Run \"&st\".\n" );
        return 1;
    }

    if ( pPars->nLutSize == -1 )
    {
        if ( pPars->pLutLib == NULL )
        {
            Abc_Print( -1, "The LUT library is not given.\n" );
            return 1;
        }
        // get LUT size from the library
        pPars->nLutSize = pPars->pLutLib->LutMax;
        // if variable pin delay, force truth table computation
//        if ( pPars->pLutLib->fVarPinDelays )
//            pPars->fTruth = 1;
    }

    if ( pPars->nLutSize < 2 || pPars->nLutSize > IF_MAX_LUTSIZE )
    {
        Abc_Print( -1, "Incorrect LUT size (%d).\n", pPars->nLutSize );
        return 1;
    }

    if ( pPars->nCutsMax < 1 || pPars->nCutsMax >= (1<<12) )
    {
        Abc_Print( -1, "Incorrect number of cuts.\n" );
        return 1;
    }

    // enable truth table computation if choices are selected
    if ( Gia_ManHasChoices(pAbc->pGia) )
    {
//        if ( !Abc_FrameReadFlag("silentmode") )
//            Abc_Print( 0, "Performing LUT mapping with choices.\n" );
        pPars->fExpRed = 0;
    }

    if ( pPars->fUseBat )
    {
        if ( pPars->nLutSize < 4 || pPars->nLutSize > 6 )
        {
            Abc_Print( -1, "This feature only works for {4,5,6}-LUTs.\n" );
            return 1;
        }
        pPars->fCutMin = 1;
    }

    if ( pPars->fEnableCheck07 + pPars->fUseCofVars + pPars->fUseDsdTune + pPars->fEnableCheck75 + pPars->fEnableCheck75u + (pPars->pLutStruct != NULL) > 1 )
    {
        Abc_Print( -1, "Only one additional check can be performed at the same time.\n" );
        return 1;
    }
    if ( pPars->fEnableCheck07 )
    {
        if ( pPars->nLutSize < 6 || pPars->nLutSize > 7 )
        {
            Abc_Print( -1, "This feature only works for {6,7}-LUTs.\n" );
            return 1;
        }
        pPars->pFuncCell = If_CutPerformCheck07;
        pPars->fCutMin = 1;
    }
    if ( pPars->fUseCofVars )
    {
        if ( !(pPars->nLutSize & 1) )
        {
            Abc_Print( -1, "This feature only works for odd-sized LUTs.\n" );
            return 1;
        }
        pPars->fCutMin = 1;
    }
    if ( pPars->fUseAndVars )
        pPars->fCutMin = 1;
    if ( pPars->fUseDsdTune )
    {
        If_DsdMan_t * pDsdMan = (If_DsdMan_t *)Abc_FrameReadManDsd();
        if ( pDsdMan == NULL )
        {
            Abc_Print( -1, "DSD manager is not available.\n" );
            return 1;
        }
        if ( pPars->nLutSize > If_DsdManVarNum(pDsdMan) )
        {
            Abc_Print( -1, "LUT size (%d) is more than the number of variables in the DSD manager (%d).\n", pPars->nLutSize, If_DsdManVarNum(pDsdMan) );
            return 1;
        }
        if ( pPars->fDeriveLuts && If_DsdManGetCellStr(pDsdMan) == NULL )
        {
            Abc_Print( -1, "DSD manager is not matched with any particular cell.\n" );
            return 1;
        }
        pPars->fCutMin = 1;
        pPars->fUseDsd = 1;
        If_DsdManSetNewAsUseless( pDsdMan );
    }
    if ( pPars->fEnableCheck75 || pPars->fEnableCheck75u )
    {
        if ( pPars->fEnableCheck75 && pPars->fEnableCheck75u )
        {
            Abc_Print( -1, "Switches -f and -u are not compatible.\n" );
            return 1;
        }
        if ( pPars->nLutSize < 5 || pPars->nLutSize > 8 )
        {
            Abc_Print( -1, "This feature only works for {6,7,8}-LUTs.\n" );
            return 1;
        }
        pPars->pFuncCell = If_CutPerformCheck75;
        pPars->fCutMin = 1;
    }
    if ( pPars->pLutStruct )
    {
        if ( pPars->fDsdBalance )
        {
            Abc_Print( -1, "Incompatible options (-S and -x).\n" );
            return 1;
        }
        if ( pPars->nLutSize < 6 || pPars->nLutSize > 16 )
        {
            Abc_Print( -1, "This feature only works for [6;16]-LUTs.\n" );
            return 1;
        }
        pPars->pFuncCell = pPars->fDelayOptLut ? NULL : If_CutPerformCheck16;
        pPars->fCutMin = 1;
    }

    if ( pPars->fUse34Spec )
    {
        pPars->fTruth    = 1;
        pPars->fCutMin   = 1;
        pPars->nLutSize  = 4;
    }

    // enable truth table computation if cut minimization is selected
    if ( pPars->fCutMin || pPars->fDeriveLuts )
    {
        pPars->fTruth = 1;
        pPars->fExpRed = 0;
        if ( pPars->pLutStruct == NULL && !pPars->fUseDsdTune )
            pPars->fDeriveLuts = 1;
    }
    // modify the subgraph recording
    if ( pPars->fUserRecLib )
    {
        pPars->fTruth      =  1;
        pPars->fCutMin     =  1;
        pPars->fExpRed     =  0;
        pPars->fUsePerm    =  1;
        pPars->pLutLib     =  NULL;
    }
    // modify for delay optimization
    if ( pPars->fDelayOpt || pPars->fDsdBalance || pPars->fDelayOptLut )
    {
        pPars->fTruth      =  1;
        pPars->fCutMin     =  1;
        pPars->fExpRed     =  0;
        pPars->fUseDsd     =  pPars->fDsdBalance || pPars->fDelayOptLut;
        pPars->pLutLib     =  NULL;
    }
    // modify for delay optimization
    if ( pPars->nGateSize > 0 )
    {
        pPars->fTruth      =  1;
        pPars->fCutMin     =  1;
        pPars->fExpRed     =  0;
        pPars->fUsePerm    =  1;
        pPars->pLutLib     =  NULL;
        pPars->nLutSize    =  pPars->nGateSize;
    }

    if ( pPars->fUseDsd || pPars->fUseTtPerm || pPars->fLut6Filter )
    {
        pPars->fTruth      =  1;
        pPars->fCutMin     =  1;
        pPars->fExpRed     =  0;
    }

    if ( pPars->fUseDsd )
    {
        int LutSize = (pPars->pLutStruct && pPars->pLutStruct[2] == 0)? pPars->pLutStruct[0] - '0' : 0;
        If_DsdMan_t * p = (If_DsdMan_t *)Abc_FrameReadManDsd();
        if ( pPars->pLutStruct && pPars->pLutStruct[2] != 0 )
        {
            printf( "DSD only works for LUT structures XY.\n" );
            return 0;
        }
        if ( p && pPars->nLutSize > If_DsdManVarNum(p) )
        {
            printf( "DSD manager has incompatible number of variables.\n" );
            return 0;
        }
        if ( p && LutSize != If_DsdManLutSize(p) && !pPars->fDsdBalance )
        {
            printf( "DSD manager has different LUT size.\n" );
            return 0;
        }
        if ( p == NULL )
        {
            if ( LutSize > DAU_MAX_VAR || pPars->nLutSize > DAU_MAX_VAR )
            {
                printf( "Size of required DSD manager (%d) exceeds the precompiled limit (%d) (change parameter DAU_MAX_VAR).\n", LutSize, DAU_MAX_VAR );
                return 0;
            }
            Abc_FrameSetManDsd( If_DsdManAlloc(pPars->nLutSize, LutSize) );
        }
    }

    if ( pPars->fUserRecLib )
    {
        if ( !Abc_NtkRecIsRunning3() )
        {
            printf( "LMS manager is not running (use \"rec_start3\").\n" );
            return 0;
        }
        if ( Abc_NtkRecInputNum3() != pPars->nLutSize )
        {
            printf( "The number of library inputs (%d) different from the K parameters (%d).\n", Abc_NtkRecInputNum3(), pPars->nLutSize );
            return 0;
        }
    }

    // complain if truth tables are requested but the cut size is too large
    if ( pPars->fTruth && pPars->nLutSize > IF_MAX_FUNC_LUTSIZE )
    {
        Abc_Print( -1, "Truth tables cannot be computed for LUT larger than %d inputs.\n", IF_MAX_FUNC_LUTSIZE );
        return 1;
    }
    if ( pAbc->pGia->pManTime && pAbc->pLibBox == NULL )
    {
        Abc_Print( -1, "Design has boxes but box library is not entered.\n" );
        return 1;
    }

    // add wire delay to LUT library delays
    if ( pPars->WireDelay > 0 && pPars->pLutLib )
    {
        int i, k;
        for ( i = 0; i <= pPars->pLutLib->LutMax; i++ )
            for ( k = 0; k <= i; k++ )
                pPars->pLutLib->pLutDelays[i][k] += pPars->WireDelay;
    }
    // perform mapping
    pNew = Gia_ManPerformMapping( pAbc->pGia, pPars );
    // subtract wire delay from LUT library delays
    if ( pPars->WireDelay > 0 && pPars->pLutLib )
    {
        int i, k;
        for ( i = 0; i <= pPars->pLutLib->LutMax; i++ )
            for ( k = 0; k <= i; k++ )
                pPars->pLutLib->pLutDelays[i][k] -= pPars->WireDelay;
    }
    if ( pNew == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9If(): Mapping of GIA has failed.\n" );
        return 1;
    }
    Abc_FrameUpdateGia( pAbc, pNew );
    return 0;

usage:
    if ( pPars->DelayTarget == -1 )
        sprintf(Buffer, "best possible" );
    else
        sprintf(Buffer, "%.2f", pPars->DelayTarget );
    if ( pPars->nLutSize == -1 )
        sprintf(LutSize, "library" );
    else
        sprintf(LutSize, "%d", pPars->nLutSize );
    Abc_Print( -2, "usage: &if [-KCFAGRTXY num] [-DEW float] [-S str] [-qarlepmsdbgxyofuijkztnchvw]\n" );
    Abc_Print( -2, "\t           performs FPGA technology mapping of the network\n" );
    Abc_Print( -2, "\t-K num   : the number of LUT inputs (2 < num < %d) [default = %s]\n", IF_MAX_LUTSIZE+1, LutSize );
    Abc_Print( -2, "\t-C num   : the max number of priority cuts (0 < num < 2^12) [default = %d]\n", pPars->nCutsMax );
    Abc_Print( -2, "\t-F num   : the number of area flow recovery iterations (num >= 0) [default = %d]\n", pPars->nFlowIters );
    Abc_Print( -2, "\t-A num   : the number of exact area recovery iterations (num >= 0) [default = %d]\n", pPars->nAreaIters );
    Abc_Print( -2, "\t-G num   : the max AND/OR gate size for mapping (0 = unused) [default = %d]\n", pPars->nGateSize );
    Abc_Print( -2, "\t-R num   : the delay relaxation ratio (num >= 0) [default = %d]\n", pPars->nRelaxRatio );
    Abc_Print( -2, "\t-T num   : the type of LUT structures [default = any]\n", pPars->nStructType );
    Abc_Print( -2, "\t-X num   : delay of AND-gate in LUT library units [default = %d]\n", pPars->nAndDelay );
    Abc_Print( -2, "\t-Y num   : area of AND-gate in LUT library units [default = %d]\n", pPars->nAndArea );
    Abc_Print( -2, "\t-D float : sets the delay constraint for the mapping [default = %s]\n", Buffer );
    Abc_Print( -2, "\t-E float : sets epsilon used for tie-breaking [default = %f]\n", pPars->Epsilon );
    Abc_Print( -2, "\t-W float : sets wire delay between adjects LUTs [default = %f]\n", pPars->WireDelay );
    Abc_Print( -2, "\t-S str   : string representing the LUT structure [default = %s]\n", pPars->pLutStruct ? pPars->pLutStruct : "not used" );
    Abc_Print( -2, "\t-q       : toggles preprocessing using several starting points [default = %s]\n", pPars->fPreprocess? "yes": "no" );
    Abc_Print( -2, "\t-a       : toggles area-oriented mapping [default = %s]\n", pPars->fArea? "yes": "no" );
    Abc_Print( -2, "\t-r       : enables expansion/reduction of the best cuts [default = %s]\n", pPars->fExpRed? "yes": "no" );
//    Abc_Print( -2, "\t-l       : optimizes latch paths for delay, other paths for area [default = %s]\n", pPars->fLatchPaths? "yes": "no" );
    Abc_Print( -2, "\t-l       : toggle restricting the type of 6-input lookup tables [default = %s]\n", pPars->fLut6Filter? "yes": "no" );
    Abc_Print( -2, "\t-e       : uses edge-based cut selection heuristics [default = %s]\n", pPars->fEdge? "yes": "no" );
    Abc_Print( -2, "\t-p       : uses power-aware cut selection heuristics [default = %s]\n", pPars->fPower? "yes": "no" );
    Abc_Print( -2, "\t-m       : enables cut minimization by removing vacuous variables [default = %s]\n", pPars->fCutMin? "yes": "no" );
    Abc_Print( -2, "\t-s       : toggles delay-oriented mapping used with -S <NN> [default = %s]\n", pPars->fDelayOptLut? "yes": "no" );
    Abc_Print( -2, "\t-d       : toggles deriving specialized matching step [default = %s]\n", pPars->fUse34Spec? "yes": "no" );
    Abc_Print( -2, "\t-b       : toggles the use of one special feature [default = %s]\n", pPars->fUseBat? "yes": "no" );
    Abc_Print( -2, "\t-g       : toggles delay optimization by SOP balancing [default = %s]\n", pPars->fDelayOpt? "yes": "no" );
    Abc_Print( -2, "\t-x       : toggles delay optimization by DSD balancing [default = %s]\n", pPars->fDsdBalance? "yes": "no" );
    Abc_Print( -2, "\t-y       : toggles delay optimization with recorded library [default = %s]\n", pPars->fUserRecLib? "yes": "no" );
    Abc_Print( -2, "\t-o       : toggles using buffers to decouple combinational outputs [default = %s]\n", pPars->fUseBuffs? "yes": "no" );
    Abc_Print( -2, "\t-f       : toggles enabling additional check [default = %s]\n", pPars->fEnableCheck75? "yes": "no" );
    Abc_Print( -2, "\t-u       : toggles enabling additional check [default = %s]\n", pPars->fEnableCheck75u? "yes": "no" );
    Abc_Print( -2, "\t-i       : toggles using cofactoring variables [default = %s]\n", pPars->fUseCofVars? "yes": "no" );
//    Abc_Print( -2, "\t-j       : toggles enabling additional check [default = %s]\n", pPars->fEnableCheck07? "yes": "no" );
    Abc_Print( -2, "\t-j       : toggles using AND bi-decomposition [default = %s]\n", pPars->fUseAndVars? "yes": "no" );
    Abc_Print( -2, "\t-k       : toggles matching based on precomputed DSD manager [default = %s]\n", pPars->fUseDsdTune? "yes": "no" );
    Abc_Print( -2, "\t-z       : toggles deriving LUTs when mapping into LUT structures [default = %s]\n", pPars->fDeriveLuts? "yes": "no" );
    Abc_Print( -2, "\t-t       : toggles optimizing average rather than maximum level [default = %s]\n", pPars->fDoAverage? "yes": "no" );
    Abc_Print( -2, "\t-n       : toggles computing DSDs of the cut functions [default = %s]\n", pPars->fUseDsd? "yes": "no" );
    Abc_Print( -2, "\t-c       : toggles computing truth tables in a new way [default = %s]\n", pPars->fUseTtPerm? "yes": "no" );
    Abc_Print( -2, "\t-h       : toggles rehashing AIG after mapping [default = %s]\n", pPars->fHashMapping? "yes": "no" );
    Abc_Print( -2, "\t-v       : toggles verbose output [default = %s]\n", pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-w       : toggles printing delay trace [default = %s]\n", pPars->fVerboseTrace? "yes": "no" );
    return 1;
}